

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O0

void __thiscall
node::BlockManager::FindFilesToPrune
          (BlockManager *this,set<int,_std::less<int>,_std::allocator<int>_> *setFilesToPrune,
          int last_prune,Chainstate *chain,ChainstateManager *chainman)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  ConstevalFormatString<7U> fmt;
  string_view source_file;
  string_view logging_function;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  size_type sVar9;
  undefined8 args_6;
  unsigned_long *puVar10;
  ulong uVar11;
  ulong uVar12;
  ChainstateManager *this_00;
  uint64_t uVar13;
  undefined8 args_2;
  uint *puVar14;
  uint *puVar15;
  reference pvVar16;
  long in_R8;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar17;
  value_type *fileinfo;
  uint64_t remaining_blocks;
  int chain_tip_height;
  uint64_t nBytesToPrune;
  uint64_t nBuffer;
  uint64_t nCurrentUsage;
  type *last_block_can_prune;
  type *min_block_to_prune;
  uint64_t target_sync_height;
  unsigned_long target;
  int fileNumber;
  int count;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  unsigned_long *in_stack_fffffffffffffde0;
  Chainstate *in_stack_fffffffffffffde8;
  ChainstateManager *in_stack_fffffffffffffdf0;
  BlockManager *in_stack_fffffffffffffdf8;
  char *in_stack_fffffffffffffe00;
  char *in_stack_fffffffffffffe08;
  AnnotatedMixin<std::recursive_mutex> *in_stack_fffffffffffffe10;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe2c;
  _Rb_tree_const_iterator<int> in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe4c;
  BlockManager *this_01;
  undefined4 in_stack_fffffffffffffe88;
  char *pcVar18;
  char *pcVar19;
  undefined4 in_stack_fffffffffffffe98;
  char *local_118;
  uint64_t local_110;
  Level in_stack_ffffffffffffff80;
  ChainstateRole *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff98;
  int iVar20;
  undefined8 in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
             in_stack_fffffffffffffe00,(int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffdf8 >> 0x18,0));
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
             in_stack_fffffffffffffe00,(int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffdf8 >> 0x18,0));
  pcVar8 = (char *)GetPruneTarget((BlockManager *)
                                  CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  ChainstateManager::GetAll
            ((ChainstateManager *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  sVar9 = std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::size
                    ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)
                     CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  args_6 = (ulong)pcVar8 / sVar9;
  puVar10 = std::max<unsigned_long>
                      (in_stack_fffffffffffffde0,
                       (unsigned_long *)
                       CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  pcVar18 = (char *)*puVar10;
  std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::~vector
            ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)in_stack_fffffffffffffde8);
  uVar11 = (ulong)*(int *)(*(long *)(in_R8 + 0xce8) + 0x18);
  pcVar19 = pcVar18;
  iVar5 = CChain::Height((CChain *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  if ((-1 < iVar5) && (pcVar18 != (char *)0x0)) {
    iVar6 = CChain::Height((CChain *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    uVar12 = (ulong)iVar6;
    this_00 = (ChainstateManager *)
              ChainstateManager::GetParams
                        ((ChainstateManager *)
                         CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    uVar13 = CChainParams::PruneAfterHeight
                       ((CChainParams *)
                        CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    if (uVar13 < uVar12) {
      args_2 = ChainstateManager::GetPruneRange
                         (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                          in_stack_fffffffffffffe2c);
      this_01 = (BlockManager *)&stack0xffffffffffffffa0;
      puVar14 = (uint *)std::get<0ul,int,int>
                                  ((pair<int,_int> *)
                                   CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      puVar15 = (uint *)std::get<1ul,int,int>
                                  ((pair<int,_int> *)
                                   CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      local_110 = CalculateCurrentUsage(in_stack_fffffffffffffdf8);
      local_118 = 
      "oximate fee per kilobyte needed for a transaction to begin\nconfirmation within conf_target blocks if possible. Uses virtual transaction size as\ndefined in BIP 141 (witness data is discounted).\n"
      ;
      iVar20 = 0;
      if (pcVar18 <=
          "\nWARNING: This interface is unstable and may disappear or change!\n\nWARNING: This is an advanced API call that is tightly coupled to the specific\nimplementation of fee estimation. The parameters it can be called with\nand the results it returns will change if the internal implementation changes.\n\nEstimates the approximate fee per kilobyte needed for a transaction to begin\nconfirmation within conf_target blocks if possible. Uses virtual transaction size as\ndefined in BIP 141 (witness data is discounted).\n"
          + local_110 + 0x13a) {
        iVar7 = CChain::Height((CChain *)
                               CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
        bVar4 = ChainstateManager::IsInitialBlockDownload(this_00);
        if ((bVar4) && ((ulong)(long)iVar7 < uVar11)) {
          local_118 = "\nWARNING: This interface is unstable and may disappear or change!\n\nWARNING: This is an advanced API call that is tightly coupled to the specific\nimplementation of fee estimation. The parameters it can be called with\nand the results it returns will change if the internal implementation changes.\n\nEstimates the approximate fee per kilobyte needed for a transaction to begin\nconfirmation within conf_target blocks if possible. Uses virtual transaction size as\ndefined in BIP 141 (witness data is discounted).\n"
                      + (uVar11 - (long)iVar7) * 1000000 + 0x13a;
        }
        iVar7 = 0;
        while (in_stack_ffffffffffffff98 = iVar7,
              in_stack_fffffffffffffe4c = MaxBlockfileNum(in_stack_fffffffffffffdf8),
              iVar7 < in_stack_fffffffffffffe4c) {
          pvVar16 = std::vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>::operator[]
                              ((vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_> *)
                               in_stack_fffffffffffffde8,(size_type)in_stack_fffffffffffffde0);
          uVar1 = pvVar16->nSize;
          uVar2 = pvVar16->nUndoSize;
          if (pvVar16->nSize != 0) {
            if (local_118 + local_110 < pcVar18) break;
            if ((pvVar16->nHeightLast <= *puVar15) && (*puVar14 <= pvVar16->nHeightFirst)) {
              PruneOneBlockFile(this_01,(int)((ulong)pvVar16 >> 0x20));
              pVar17 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                                 ((set<int,_std::less<int>,_std::allocator<int>_> *)
                                  in_stack_fffffffffffffde8,
                                  (value_type_conflict4 *)in_stack_fffffffffffffde0);
              in_stack_fffffffffffffe40 = pVar17.first._M_node;
              local_110 = local_110 - (uVar1 + uVar2);
              iVar20 = iVar20 + 1;
            }
          }
          iVar7 = in_stack_ffffffffffffff98 + 1;
        }
      }
      bVar4 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                                  Trace);
      if (bVar4) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffdf8,
                   (char *)in_stack_fffffffffffffdf0);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffdf8,
                   (char *)in_stack_fffffffffffffdf0);
        Chainstate::GetRole(in_stack_fffffffffffffde8);
        in_stack_fffffffffffffdd8 = 1;
        logging_function._M_str = pcVar8;
        logging_function._M_len = (size_t)puVar10;
        source_file._M_str._0_4_ = in_stack_fffffffffffffe98;
        source_file._M_len = (size_t)pcVar19;
        source_file._M_str._4_4_ = iVar5;
        fmt.fmt._4_4_ = iVar6;
        fmt.fmt._0_4_ = in_stack_fffffffffffffe88;
        LogPrintFormatInternal<ChainstateRole,unsigned_long,unsigned_long,long,int,int,int>
                  (logging_function,source_file,in_stack_fffffffffffffe4c,
                   (LogFlags)in_stack_fffffffffffffe40._M_node,in_stack_ffffffffffffff80,fmt,
                   in_stack_ffffffffffffff90,
                   (unsigned_long *)CONCAT44(iVar20,in_stack_ffffffffffffff98),
                   (unsigned_long *)args_2,(long *)in_stack_ffffffffffffffa8,
                   (int *)in_stack_ffffffffffffffb0,(int *)in_stack_ffffffffffffffb8,(int *)args_6);
      }
    }
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BlockManager::FindFilesToPrune(
    std::set<int>& setFilesToPrune,
    int last_prune,
    const Chainstate& chain,
    ChainstateManager& chainman)
{
    LOCK2(cs_main, cs_LastBlockFile);
    // Distribute our -prune budget over all chainstates.
    const auto target = std::max(
        MIN_DISK_SPACE_FOR_BLOCK_FILES, GetPruneTarget() / chainman.GetAll().size());
    const uint64_t target_sync_height = chainman.m_best_header->nHeight;

    if (chain.m_chain.Height() < 0 || target == 0) {
        return;
    }
    if (static_cast<uint64_t>(chain.m_chain.Height()) <= chainman.GetParams().PruneAfterHeight()) {
        return;
    }

    const auto [min_block_to_prune, last_block_can_prune] = chainman.GetPruneRange(chain, last_prune);

    uint64_t nCurrentUsage = CalculateCurrentUsage();
    // We don't check to prune until after we've allocated new space for files
    // So we should leave a buffer under our target to account for another allocation
    // before the next pruning.
    uint64_t nBuffer = BLOCKFILE_CHUNK_SIZE + UNDOFILE_CHUNK_SIZE;
    uint64_t nBytesToPrune;
    int count = 0;

    if (nCurrentUsage + nBuffer >= target) {
        // On a prune event, the chainstate DB is flushed.
        // To avoid excessive prune events negating the benefit of high dbcache
        // values, we should not prune too rapidly.
        // So when pruning in IBD, increase the buffer to avoid a re-prune too soon.
        const auto chain_tip_height = chain.m_chain.Height();
        if (chainman.IsInitialBlockDownload() && target_sync_height > (uint64_t)chain_tip_height) {
            // Since this is only relevant during IBD, we assume blocks are at least 1 MB on average
            static constexpr uint64_t average_block_size = 1000000;  /* 1 MB */
            const uint64_t remaining_blocks = target_sync_height - chain_tip_height;
            nBuffer += average_block_size * remaining_blocks;
        }

        for (int fileNumber = 0; fileNumber < this->MaxBlockfileNum(); fileNumber++) {
            const auto& fileinfo = m_blockfile_info[fileNumber];
            nBytesToPrune = fileinfo.nSize + fileinfo.nUndoSize;

            if (fileinfo.nSize == 0) {
                continue;
            }

            if (nCurrentUsage + nBuffer < target) { // are we below our target?
                break;
            }

            // don't prune files that could have a block that's not within the allowable
            // prune range for the chain being pruned.
            if (fileinfo.nHeightLast > (unsigned)last_block_can_prune || fileinfo.nHeightFirst < (unsigned)min_block_to_prune) {
                continue;
            }

            PruneOneBlockFile(fileNumber);
            // Queue up the files for removal
            setFilesToPrune.insert(fileNumber);
            nCurrentUsage -= nBytesToPrune;
            count++;
        }
    }

    LogDebug(BCLog::PRUNE, "[%s] target=%dMiB actual=%dMiB diff=%dMiB min_height=%d max_prune_height=%d removed %d blk/rev pairs\n",
             chain.GetRole(), target / 1024 / 1024, nCurrentUsage / 1024 / 1024,
             (int64_t(target) - int64_t(nCurrentUsage)) / 1024 / 1024,
             min_block_to_prune, last_block_can_prune, count);
}